

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_widget.c
# Opt level: O3

ugui_text_widget_t * ugui_text_widget_create(ugui_rect_t bounds)

{
  ugui_text_widget_t *ctx;
  ugui_layer_t *layer;
  
  ctx = (ugui_text_widget_t *)malloc(0x20);
  layer = ugui_layer_create(bounds);
  ctx->widget_layer = layer;
  ctx->text = fake_text;
  ctx->font = &font_robotomono_regular_16;
  ugui_layer_set_update(layer,text_widget_layer_update);
  ugui_layer_set_ctx(layer,ctx);
  return ctx;
}

Assistant:

ugui_text_widget_t *ugui_text_widget_create(ugui_rect_t bounds)
{
    ugui_text_widget_t* text_widget = (ugui_text_widget_t*)malloc(sizeof(ugui_text_widget_t));

    text_widget->widget_layer = ugui_layer_create(bounds);

    // Set defaults
    text_widget->text = fake_text;
    text_widget->font = FONT_DEFAULT;

    // Bind update method
    ugui_layer_set_update(text_widget->widget_layer, text_widget_layer_update);
    // Bind text_widget instance to layer context for use in update and other calls
    ugui_layer_set_ctx(text_widget->widget_layer, (void*) text_widget);

    return text_widget;
}